

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

light_pcapng light_read_from_memory(uint32_t *memory,size_t size)

{
  uint *__src;
  ulong uVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  light_pcapng p_Var5;
  uint32_t *puVar6;
  size_t *psVar7;
  ulong *puVar8;
  _light_option *p_Var9;
  light_pcapng p_Var10;
  ulong uVar11;
  void *x_ret;
  int32_t max_len;
  uint uVar12;
  light_pcapng p_Var13;
  undefined8 uStackY_70;
  uint *local_60;
  light_pcapng local_58;
  uint32_t *local_50;
  size_t local_48;
  size_t sStack_40;
  ulong local_38;
  
  p_Var13 = (light_pcapng)0x0;
  p_Var10 = (light_pcapng)0x0;
  do {
    if (size < 0xd) {
      return p_Var13;
    }
    p_Var5 = (light_pcapng)calloc(1,0x20);
    if (p_Var10 == (light_pcapng)0x0) {
      if (p_Var5 == (light_pcapng)0x0) {
        uStackY_70 = 0x60;
        goto LAB_0010288b;
      }
      if (p_Var13 == (light_pcapng)0x0) {
        p_Var13 = p_Var5;
      }
    }
    else {
      p_Var10->next_block = p_Var5;
      if (p_Var5 == (light_pcapng)0x0) {
        uStackY_70 = 0x68;
LAB_0010288b:
        fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                ,"__parse_mem_copy",uStackY_70);
        return p_Var13;
      }
    }
    uVar4 = *memory;
    p_Var5->block_type = uVar4;
    __src = memory + 2;
    uVar12 = memory[1];
    p_Var5->block_total_lenght = uVar12;
    local_60 = __src;
    if ((uVar12 & 3) != 0) {
      fprintf(_stderr,"ERROR at %s::%s::%d: %d <= %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"__parse_mem_copy",0x6f,0,0);
      uVar4 = p_Var5->block_type;
    }
    local_38 = size;
    if (uVar4 == 0xb16b00b5) {
      local_50 = memory + 5;
      uVar4 = memory[4];
      uVar1 = *(ulong *)(memory + 2);
      local_48 = uVar1 & 0xffffffff;
      uVar11 = (ulong)(((uint)uVar1 & 0xfffffffc) + 4);
      if ((uVar1 & 3) == 0) {
        uVar11 = uVar1 & 0xffffffff;
      }
      local_58 = p_Var13;
      puVar8 = (ulong *)calloc(1,uVar11 + 0xc);
      p_Var13 = local_58;
      *puVar8 = uVar1;
      *(uint32_t *)(puVar8 + 1) = uVar4;
      memcpy((void *)((long)puVar8 + 0xc),local_50,local_48);
      lVar3 = (ulong)((uint)uVar11 & 0xfffffffc) + 0x14;
      p_Var5->block_body = (uint32_t *)puVar8;
LAB_001027c7:
      local_60 = (uint *)((long)memory + lVar3);
      max_len = ((int)memory - (int)local_60) + p_Var5->block_total_lenght + -4;
LAB_001027d5:
      p_Var9 = __parse_options(&local_60,max_len);
      p_Var5->options = p_Var9;
    }
    else {
      if (uVar4 == 1) {
        puVar6 = (uint32_t *)calloc(1,8);
        *puVar6 = memory[2];
        local_60 = memory + 4;
        puVar6[1] = memory[3];
        p_Var5->block_body = puVar6;
        max_len = p_Var5->block_total_lenght - 0x14;
        goto LAB_001027d5;
      }
      if (uVar4 == 3) {
        local_58 = (light_pcapng)(memory + 3);
        uVar4 = memory[2];
        uVar12 = p_Var5->block_total_lenght - 0x10;
        puVar6 = (uint32_t *)calloc(1,(ulong)uVar12 + 0x14);
        *puVar6 = uVar4;
        memcpy(puVar6 + 1,local_58,(ulong)uVar12);
        local_60 = (uint *)((long)memory + (ulong)(uVar12 & 0xfffffffc) + 0xc);
        p_Var5->block_body = puVar6;
        p_Var5->options = (_light_option *)0x0;
      }
      else {
        if (uVar4 == 6) {
          local_58 = (light_pcapng)(memory + 7);
          local_50 = (uint32_t *)CONCAT44(local_50._4_4_,memory[6]);
          local_48 = *(size_t *)(memory + 2);
          sStack_40 = *(size_t *)(memory + 4);
          uVar12 = memory[5];
          uVar2 = (uVar12 & 0xfffffffc) + 4;
          if ((uVar12 & 3) == 0) {
            uVar2 = uVar12;
          }
          psVar7 = (size_t *)calloc(1,(ulong)uVar2 + 0x14);
          *psVar7 = local_48;
          psVar7[1] = sStack_40;
          *(uint32_t *)(psVar7 + 2) = (uint32_t)local_50;
          memcpy((uint32_t *)((long)psVar7 + 0x14),local_58,(ulong)uVar12);
          lVar3 = (ulong)(uVar2 & 0xfffffffc) + 0x1c;
          p_Var5->block_body = (uint32_t *)psVar7;
          goto LAB_001027c7;
        }
        if (uVar4 == 0xa0d0d0a) {
          puVar6 = (uint32_t *)calloc(1,0x10);
          *puVar6 = memory[2];
          puVar6[1] = memory[3];
          *(undefined8 *)(puVar6 + 2) = *(undefined8 *)(memory + 4);
          local_60 = memory + 6;
          p_Var5->block_body = puVar6;
          max_len = p_Var5->block_total_lenght - 0x1c;
          goto LAB_001027d5;
        }
        uVar12 = p_Var5->block_total_lenght - 0xc;
        if (uVar12 == 0) {
          p_Var5->block_body = (uint32_t *)0x0;
        }
        else {
          puVar6 = (uint32_t *)calloc((ulong)uVar12,1);
          p_Var5->block_body = puVar6;
          memcpy(puVar6,__src,(ulong)uVar12);
          local_60 = (uint *)((ulong)(uVar12 & 0xfffffffc) + (long)__src);
        }
      }
    }
    uVar1 = local_38;
    uVar11 = (ulong)*local_60;
    if (*local_60 != p_Var5->block_total_lenght) {
      fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
              ,"__parse_mem_copy",0xf8,uVar11,p_Var5->block_total_lenght);
      uVar11 = (ulong)p_Var5->block_total_lenght;
    }
    size = uVar1 - uVar11;
    memory = (uint32_t *)((long)memory + (ulong)((uint)uVar11 & 0xfffffffc));
    p_Var10 = p_Var5;
  } while( true );
}

Assistant:

light_pcapng light_read_from_memory(const uint32_t *memory, size_t size)
{
	struct _light_pcapng *head = NULL;
	__parse_mem_copy(&head, memory, size);
	return head;
}